

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

void __thiscall stk::FileWrite::closeWavFile(FileWrite *this)

{
  int iVar1;
  undefined1 local_21;
  int local_20;
  int iStack_1c;
  char sample;
  SINT32 bytes;
  int dataLocation;
  bool useExtensible;
  FileWrite *pFStack_10;
  int bytesPerSample;
  FileWrite *this_local;
  
  dataLocation = 1;
  if (this->dataType_ == 2) {
    dataLocation = 2;
  }
  else if (this->dataType_ == 4) {
    dataLocation = 3;
  }
  else if ((this->dataType_ == 8) || (this->dataType_ == 0x10)) {
    dataLocation = 4;
  }
  else if (this->dataType_ == 0x20) {
    dataLocation = 8;
  }
  bytes._3_1_ = 0;
  iStack_1c = 0x28;
  if ((2 < (uint)dataLocation) || (2 < this->channels_)) {
    bytes._3_1_ = 1;
    iStack_1c = 0x4c;
  }
  local_20 = (int)this->frameCounter_ * this->channels_ * dataLocation;
  pFStack_10 = this;
  if (local_20 % 2 != 0) {
    local_21 = 0;
    fwrite(&local_21,1,1,(FILE *)this->fd_);
  }
  fseek((FILE *)this->fd_,(long)iStack_1c,0);
  fwrite(&local_20,4,1,(FILE *)this->fd_);
  iVar1 = (int)this->frameCounter_ * this->channels_ * dataLocation;
  local_20 = iVar1 + 0x2c;
  if ((bytes._3_1_ & 1) != 0) {
    local_20 = iVar1 + 0x50;
  }
  fseek((FILE *)this->fd_,4,0);
  fwrite(&local_20,4,1,(FILE *)this->fd_);
  if ((bytes._3_1_ & 1) != 0) {
    local_20 = (int)this->frameCounter_;
    fseek((FILE *)this->fd_,0x44,0);
    fwrite(&local_20,4,1,(FILE *)this->fd_);
  }
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeWavFile( void )
{
  int bytesPerSample = 1;
  if ( dataType_ == STK_SINT16 )
    bytesPerSample = 2;
  else if ( dataType_ == STK_SINT24 )
    bytesPerSample = 3;
  else if ( dataType_ == STK_SINT32 || dataType_ == STK_FLOAT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT64 )
    bytesPerSample = 8;

  bool useExtensible = false;
  int dataLocation = 40;
  if ( bytesPerSample > 2 || channels_ > 2 ) {
    useExtensible = true;
    dataLocation = 76;
  }

  SINT32 bytes = (SINT32) (frameCounter_ * channels_ * bytesPerSample);
  if ( bytes % 2 ) { // pad extra byte if odd
    signed char sample = 0;
    fwrite( &sample, 1, 1, fd_ );
  }
#ifndef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  fseek( fd_, dataLocation, SEEK_SET ); // jump to data length
  fwrite( &bytes, 4, 1, fd_ );

  bytes = (SINT32) (frameCounter_ * channels_ * bytesPerSample + 44);
  if ( useExtensible ) bytes += 36;
#ifndef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  fseek( fd_, 4, SEEK_SET ); // jump to file size
  fwrite( &bytes, 4, 1, fd_ );

  if ( useExtensible ) { // fill in the "fact" chunk frames value
    bytes = (SINT32) frameCounter_;
#ifndef __LITTLE_ENDIAN__
    swap32((unsigned char *)&bytes);
#endif
    fseek( fd_, 68, SEEK_SET );
    fwrite( &bytes, 4, 1, fd_ );
  }

  fclose( fd_ );
}